

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dielectric.hpp
# Opt level: O0

Color __thiscall
DielectricBRDF::sample_f
          (DielectricBRDF *this,Color *albedo,vec3f *wo,vec3f *wi,float *pdf,Sampler *sampler)

{
  Color CVar1;
  undefined8 *in_RCX;
  float *in_RDX;
  long in_RDI;
  float *in_R8;
  undefined8 *in_R9;
  float fVar2;
  float r;
  float cost;
  float ior;
  float local_84;
  float *in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff90;
  vec3f local_64;
  vec3f local_58;
  float local_4c;
  float local_48;
  float local_44;
  undefined8 *local_40;
  float *local_38;
  undefined8 *local_30;
  float *local_28;
  vec3f local_c;
  
  if (in_RDX[2] <= 0.0) {
    local_84 = 1.0 / *(float *)(in_RDI + 8);
  }
  else {
    local_84 = *(float *)(in_RDI + 8);
  }
  local_44 = local_84;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_4c = reflectivity(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          (float)((ulong)in_RDI >> 0x20));
  if (((local_4c == 1.0) && (!NAN(local_4c))) ||
     (fVar2 = (float)(**(code **)*local_40)(), fVar2 < local_4c)) {
    vec3f::vec3f(&local_58,-*local_28,-local_28[1],local_28[2]);
    *local_30 = local_58._0_8_;
    *(float *)(local_30 + 1) = local_58.z;
    *local_38 = local_4c;
    vec3f::vec3f(&local_c,local_4c / ABS(*(float *)(local_30 + 1)));
  }
  else {
    vec3f::vec3f(&local_64,-*local_28 / local_44,-local_28[1] / local_44,
                 (-local_28[2] * local_48) / ABS(local_28[2]));
    *local_30 = local_64._0_8_;
    *(float *)(local_30 + 1) = local_64.z;
    *local_38 = 1.0 - local_4c;
    vec3f::vec3f(&local_c,(1.0 - local_4c) / (ABS(*(float *)(local_30 + 1)) * local_44 * local_44));
  }
  CVar1.z = local_c.z;
  CVar1.x = local_c.x;
  CVar1.y = local_c.y;
  return CVar1;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		float ior = wo.z>0? IOR: 1/IOR;
		float cost;
		float r = reflectivity(fabs(wo.z), cost, ior);

		if (r == 1 || sampler.get1f()<r) // reflected
		{
			wi = vec3f(-wo.x, -wo.y, wo.z);
			pdf = r;
			return r / fabs(wi.z);
		}
		else // transmitted
		{
			wi = vec3f(-wo.x/ior, -wo.y/ior, -wo.z * cost/fabs(wo.z));
			pdf = 1-r;
			return (1-r) / (fabs(wi.z) * ior * ior);
			// the 1/ior^2 coefficient is used to convert energy to radiance
			// see note_refract_radiance
		}
	}